

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_load(gz_statep state,uchar *buf,uint len,uint *have)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *msg;
  uint uVar4;
  int iVar5;
  
  *have = 0;
  do {
    uVar4 = len - *have;
    if (0x3fffffff < uVar4) {
      uVar4 = 0x40000000;
    }
    sVar2 = read(state->fd,buf + *have,(ulong)uVar4);
    iVar1 = (int)sVar2;
  } while ((0 < iVar1) && (uVar4 = *have, *have = uVar4 + iVar1, uVar4 + iVar1 < len));
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    msg = strerror(*piVar3);
    iVar5 = -1;
    cm_zlib_gz_error(state,-1,msg);
  }
  else {
    iVar5 = 0;
    if (iVar1 == 0) {
      state->eof = 1;
    }
  }
  return iVar5;
}

Assistant:

local int gz_load(state, buf, len, have)
    gz_statep state;
    unsigned char *buf;
    unsigned len;
    unsigned *have;
{
    int ret;
    unsigned get, max = ((unsigned)-1 >> 2) + 1;

    *have = 0;
    do {
        get = len - *have;
        if (get > max)
            get = max;
        ret = read(state->fd, buf + *have, get);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}